

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_parse_login_details
                   (char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *__dest;
  char *__dest_00;
  char *__dest_01;
  size_t __n;
  CURLcode CVar5;
  char *local_70;
  
  pcVar2 = (char *)strlen(login);
  CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (pcVar2 < "cmake_policy(SET CMP0009 NEW)\n") {
    if (passwdp == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar3 = strchr(login,0x3a);
      pcVar2 = (char *)0x0;
      if (pcVar3 < login + len) {
        pcVar2 = pcVar3;
      }
    }
    if (optionsp == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar4 = strchr(login,0x3b);
      pcVar3 = (char *)0x0;
      if (pcVar4 < login + len) {
        pcVar3 = pcVar4;
      }
    }
    if (pcVar2 == (char *)0x0) {
      __n = (long)pcVar3 - (long)login;
      if (pcVar3 == (char *)0x0) {
        __n = len;
      }
    }
    else {
      pcVar4 = pcVar2;
      if (pcVar3 < pcVar2 && pcVar3 != (char *)0x0) {
        pcVar4 = pcVar3;
      }
      __n = (long)pcVar4 - (long)login;
    }
    if (pcVar2 == (char *)0x0) {
      local_70 = (char *)0x0;
    }
    else {
      local_70 = login + len;
      if (pcVar2 < pcVar3) {
        local_70 = pcVar3;
      }
      if (pcVar3 == (char *)0x0) {
        local_70 = login + len;
      }
      local_70 = local_70 + ~(ulong)pcVar2;
    }
    CVar5 = CURLE_OK;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = login + len;
      if (pcVar3 < pcVar2) {
        pcVar4 = pcVar2;
      }
      if (pcVar2 == (char *)0x0) {
        pcVar4 = login + len;
      }
      pcVar4 = pcVar4 + ~(ulong)pcVar3;
    }
    bVar1 = 1;
    if (userp == (char **)0x0) {
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)(*Curl_cmalloc)(__n + 1);
      CVar5 = CURLE_OK;
      if (__dest == (char *)0x0) {
        CVar5 = CURLE_OUT_OF_MEMORY;
        __dest = (char *)0x0;
        bVar1 = 0;
      }
    }
    if ((bool)(bVar1 ^ 1 | passwdp == (char **)0x0 | pcVar2 == (char *)0x0)) {
      __dest_00 = (char *)0x0;
    }
    else {
      __dest_00 = (char *)(*Curl_cmalloc)((size_t)(local_70 + 1));
      CVar5 = CURLE_OK;
      if (__dest_00 == (char *)0x0) {
        (*Curl_cfree)(__dest);
        CVar5 = CURLE_OUT_OF_MEMORY;
        __dest_00 = (char *)0x0;
      }
    }
    __dest_01 = (char *)0x0;
    if (((optionsp != (char **)0x0) && (CVar5 == CURLE_OK)) && (pcVar4 != (char *)0x0)) {
      __dest_01 = (char *)(*Curl_cmalloc)((size_t)(pcVar4 + 1));
      if (__dest_01 == (char *)0x0) {
        (*Curl_cfree)(__dest_00);
        (*Curl_cfree)(__dest);
        CVar5 = CURLE_OUT_OF_MEMORY;
        __dest_01 = (char *)0x0;
      }
      else {
        CVar5 = CURLE_OK;
      }
    }
    if (CVar5 == CURLE_OK) {
      if (__dest != (char *)0x0) {
        memcpy(__dest,login,__n);
        __dest[__n] = '\0';
        (*Curl_cfree)(*userp);
        *userp = __dest;
      }
      if (__dest_00 != (char *)0x0) {
        memcpy(__dest_00,pcVar2 + 1,(size_t)local_70);
        __dest_00[(long)local_70] = '\0';
        (*Curl_cfree)(*passwdp);
        *passwdp = __dest_00;
      }
      if (__dest_01 != (char *)0x0) {
        memcpy(__dest_01,pcVar3 + 1,(size_t)pcVar4);
        __dest_01[(long)pcVar4] = '\0';
        (*Curl_cfree)(*optionsp);
        *optionsp = __dest_01;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_parse_login_details(const char *login, const size_t len,
                                  char **userp, char **passwdp,
                                  char **optionsp)
{
  CURLcode result = CURLE_OK;
  char *ubuf = NULL;
  char *pbuf = NULL;
  char *obuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  /* the input length check is because this is called directly from setopt
     and isn't going through the regular string length check */
  size_t llen = strlen(login);
  if(llen > CURL_MAX_INPUT_LENGTH)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Attempt to find the password separator */
  if(passwdp) {
    psep = strchr(login, ':');

    /* Within the constraint of the login string */
    if(psep >= login + len)
      psep = NULL;
  }

  /* Attempt to find the options separator */
  if(optionsp) {
    osep = strchr(login, ';');

    /* Within the constraint of the login string */
    if(osep >= login + len)
      osep = NULL;
  }

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
                                 (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
                                 (size_t)(login + len - osep)) - 1 : 0);

  /* Allocate the user portion buffer, which can be zero length */
  if(userp) {
    ubuf = malloc(ulen + 1);
    if(!ubuf)
      result = CURLE_OUT_OF_MEMORY;
  }

  /* Allocate the password portion buffer */
  if(!result && passwdp && psep) {
    pbuf = malloc(plen + 1);
    if(!pbuf) {
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  /* Allocate the options portion buffer */
  if(!result && optionsp && olen) {
    obuf = malloc(olen + 1);
    if(!obuf) {
      free(pbuf);
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  if(!result) {
    /* Store the user portion if necessary */
    if(ubuf) {
      memcpy(ubuf, login, ulen);
      ubuf[ulen] = '\0';
      Curl_safefree(*userp);
      *userp = ubuf;
    }

    /* Store the password portion if necessary */
    if(pbuf) {
      memcpy(pbuf, psep + 1, plen);
      pbuf[plen] = '\0';
      Curl_safefree(*passwdp);
      *passwdp = pbuf;
    }

    /* Store the options portion if necessary */
    if(obuf) {
      memcpy(obuf, osep + 1, olen);
      obuf[olen] = '\0';
      Curl_safefree(*optionsp);
      *optionsp = obuf;
    }
  }

  return result;
}